

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> * __thiscall
FillableSigningProvider::GetKeys
          (set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *__return_storage_ptr__,
          FillableSigningProvider *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&this->cs_KeyStore,
             "cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
             ,0x8b,false);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (this->mapKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->mapKeys)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    std::_Rb_tree<CKeyID,CKeyID,std::_Identity<CKeyID>,std::less<CKeyID>,std::allocator<CKeyID>>::
    _M_insert_unique<CKeyID_const&>
              ((_Rb_tree<CKeyID,CKeyID,std::_Identity<CKeyID>,std::less<CKeyID>,std::allocator<CKeyID>>
                *)__return_storage_ptr__,(CKeyID *)(p_Var2 + 1));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<CKeyID> FillableSigningProvider::GetKeys() const
{
    LOCK(cs_KeyStore);
    std::set<CKeyID> set_address;
    for (const auto& mi : mapKeys) {
        set_address.insert(mi.first);
    }
    return set_address;
}